

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

char * __thiscall
flatbuffers::JsonPrinter::PrintOffset
          (JsonPrinter *this,void *val,Type *type,int indent,uint8_t *prev_val,
          soffset_t vector_index)

{
  byte bVar1;
  bool bVar2;
  EnumVal *pEVar3;
  char *pcVar4;
  Type local_50;
  
LAB_0013b060:
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    bVar2 = EscapeString((char *)((long)val + 4),(ulong)*val,this->text,this->opts->allow_non_utf8,
                         this->opts->natural_utf8);
    if (bVar2) {
      return (char *)0x0;
    }
    return "string contains non-utf8 bytes";
  case BASE_TYPE_VECTOR:
    local_50.base_type = type->element;
    local_50.fixed_length = type->fixed_length;
    local_50.element = BASE_TYPE_NONE;
    local_50.struct_def = type->struct_def;
    local_50.enum_def = type->enum_def;
    switch(local_50.base_type) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_UCHAR:
      pcVar4 = PrintVector<unsigned_char,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_CHAR:
      pcVar4 = PrintVector<signed_char,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_SHORT:
      pcVar4 = PrintVector<short,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_USHORT:
      pcVar4 = PrintVector<unsigned_short,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_INT:
    case BASE_TYPE_ARRAY:
      pcVar4 = PrintVector<int,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_UINT:
      pcVar4 = PrintVector<unsigned_int,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_LONG:
      pcVar4 = PrintVector<long,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_ULONG:
      pcVar4 = PrintVector<unsigned_long,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_FLOAT:
      pcVar4 = PrintVector<float,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_DOUBLE:
      pcVar4 = PrintVector<double,unsigned_int>(this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      pcVar4 = PrintVector<flatbuffers::Offset<void>,unsigned_int>
                         (this,val,&local_50,indent,prev_val);
      break;
    case BASE_TYPE_VECTOR64:
      pcVar4 = PrintVector<flatbuffers::Offset64<void>,unsigned_int>
                         (this,val,&local_50,indent,prev_val);
      break;
    default:
      goto LAB_0013b448;
    }
    break;
  case BASE_TYPE_STRUCT:
    pcVar4 = GenStruct(this,type->struct_def,(Table *)val,indent);
    return pcVar4;
  case BASE_TYPE_UNION:
    goto switchD_0013b077_caseD_10;
  case BASE_TYPE_ARRAY:
    local_50.base_type = type->element;
    local_50.fixed_length = type->fixed_length;
    local_50.element = BASE_TYPE_NONE;
    local_50.struct_def = type->struct_def;
    local_50.enum_def = type->enum_def;
    switch(local_50.base_type) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_UCHAR:
      pcVar4 = PrintArray<unsigned_char>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_CHAR:
      pcVar4 = PrintArray<signed_char>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_SHORT:
      pcVar4 = PrintArray<short>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_USHORT:
      pcVar4 = PrintArray<unsigned_short>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_INT:
      pcVar4 = PrintArray<int>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_UINT:
      pcVar4 = PrintArray<unsigned_int>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_LONG:
      pcVar4 = PrintArray<long>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_ULONG:
      pcVar4 = PrintArray<unsigned_long>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_FLOAT:
      pcVar4 = PrintArray<float>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_DOUBLE:
      pcVar4 = PrintArray<double>(this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      pcVar4 = PrintArray<flatbuffers::Offset<void>>
                         (this,val,local_50.fixed_length,&local_50,indent);
      break;
    case BASE_TYPE_ARRAY:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0xee,
                    "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                   );
    case BASE_TYPE_VECTOR64:
      pcVar4 = PrintArray<flatbuffers::Offset64<void>>
                         (this,val,local_50.fixed_length,&local_50,indent);
      break;
    default:
      goto LAB_0013b448;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0xf3,
                  "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                 );
  }
  if (pcVar4 != (char *)0x0) {
    return pcVar4;
  }
LAB_0013b448:
  return (char *)0x0;
switchD_0013b077_caseD_10:
  if ((uint *)prev_val == (uint *)0x0) {
    __assert_fail("prev_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0xb9,
                  "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                 );
  }
  if (vector_index < 0) {
    bVar1 = (byte)*(uint *)prev_val;
  }
  else {
    bVar1 = Vector<unsigned_char,_unsigned_int>::Get
                      ((Vector<unsigned_char,_unsigned_int> *)
                       ((ulong)*(uint *)prev_val + (long)prev_val),vector_index);
  }
  pEVar3 = EnumDef::ReverseLookup(type->enum_def,(ulong)bVar1,true);
  type = &pEVar3->union_type;
  prev_val = (uint8_t *)0x0;
  vector_index = 0xffffffff;
  if (pEVar3 == (EnumVal *)0x0) {
    return "unknown enum value";
  }
  goto LAB_0013b060;
}

Assistant:

const char *PrintOffset(const void *val, const Type &type, int indent,
                          const uint8_t *prev_val, soffset_t vector_index) {
    switch (type.base_type) {
      case BASE_TYPE_UNION: {
        // If this assert hits, you have an corrupt buffer, a union type field
        // was not present or was out of range.
        FLATBUFFERS_ASSERT(prev_val);
        auto union_type_byte = *prev_val;  // Always a uint8_t.
        if (vector_index >= 0) {
          auto type_vec = reinterpret_cast<const Vector<uint8_t> *>(
              prev_val + ReadScalar<uoffset_t>(prev_val));
          union_type_byte = type_vec->Get(static_cast<uoffset_t>(vector_index));
        }
        auto enum_val = type.enum_def->ReverseLookup(union_type_byte, true);
        if (enum_val) {
          return PrintOffset(val, enum_val->union_type, indent, nullptr, -1);
        } else {
          return "unknown enum value";
        }
      }
      case BASE_TYPE_STRUCT:
        return GenStruct(*type.struct_def, reinterpret_cast<const Table *>(val),
                         indent);
      case BASE_TYPE_STRING: {
        auto s = reinterpret_cast<const String *>(val);
        bool ok = EscapeString(s->c_str(), s->size(), &text,
                               opts.allow_non_utf8, opts.natural_utf8);
        return ok ? nullptr : "string contains non-utf8 bytes";
      }
      case BASE_TYPE_VECTOR: {
        const auto vec_type = type.VectorType();
        // Call PrintVector above specifically for each element type:
        // clang-format off
        switch (vec_type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            auto err = PrintVector<CTYPE>(val, vec_type, indent, prev_val); \
            if (err) return err; \
            break; }
          FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        }
        // clang-format on
        return nullptr;
      }
      case BASE_TYPE_ARRAY: {
        const auto vec_type = type.VectorType();
        // Call PrintArray above specifically for each element type:
        // clang-format off
        switch (vec_type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            auto err = PrintArray<CTYPE>(val, type.fixed_length, vec_type, indent); \
            if (err) return err; \
            break; }
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
              // Arrays of scalars or structs are only possible.
              FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
          case BASE_TYPE_ARRAY: FLATBUFFERS_ASSERT(0);
        }
        // clang-format on
        return nullptr;
      }
      default: FLATBUFFERS_ASSERT(0); return "unknown type";
    }
  }